

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O3

EncoderStatus __thiscall mp3_encoder::Encoder::encode(Encoder *this)

{
  pointer pcVar1;
  element_type *peVar2;
  element_type *peVar3;
  long lVar4;
  int iVar5;
  FILE *__stream;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  FILE *__s;
  size_t sVar8;
  EncoderStatus EVar9;
  size_type __pos;
  string mp3_file_path;
  long *local_40 [2];
  long local_30 [2];
  
  __stream = fopen((this->m_wavFilePath)._M_dataplus._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    EVar9 = OpenFileError;
  }
  else {
    sVar6 = (this->m_wavFilePath)._M_string_length;
    if (sVar6 == 0) {
LAB_00102df7:
      __pos = 0;
    }
    else {
      sVar6 = sVar6 + 1;
      do {
        if (sVar6 == 1) goto LAB_00102df7;
        __pos = sVar6 - 1;
        lVar4 = sVar6 - 2;
        sVar6 = __pos;
      } while ((this->m_wavFilePath)._M_dataplus._M_p[lVar4] != '.');
    }
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&this->m_wavFilePath,__pos,3,"mp3",3);
    pcVar1 = (pbVar7->_M_dataplus)._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar1,pcVar1 + pbVar7->_M_string_length);
    __s = fopen((char *)local_40[0],"wb");
    if (__s == (FILE *)0x0) {
      EVar9 = OpenFileError;
    }
    else {
      fread(&this->m_wavHeader,0x2c,1,__stream);
      while (sVar8 = fread((this->m_wavBuffer).super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,(ulong)((uint)(this->m_wavHeader).numChannels * 2),0x1000,
                           __stream), sVar8 != 0) {
        peVar2 = (this->m_wavBuffer).super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar3 = (this->m_mp3Buffer).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if ((this->m_wavHeader).numChannels == 1) {
          iVar5 = lame_encode_buffer(this->m_lameFlags,peVar2,0,sVar8 & 0xffffffff,peVar3,0x1000);
        }
        else {
          iVar5 = lame_encode_buffer_interleaved
                            (this->m_lameFlags,peVar2,sVar8 & 0xffffffff,peVar3,0x1000);
        }
        fwrite((this->m_mp3Buffer).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(long)iVar5,1,__s);
      }
      iVar5 = lame_encode_flush(this->m_lameFlags,
                                (this->m_mp3Buffer).
                                super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                ,0x1000);
      fwrite((this->m_mp3Buffer).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(long)iVar5,1,__s);
      fclose(__stream);
      fclose(__s);
      EVar9 = StatusOk;
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return EVar9;
}

Assistant:

EncoderStatus Encoder::encode()
    {
        auto const wavFile = fopen(m_wavFilePath.c_str(), "rb");
        if(!wavFile)
        {
            return EncoderStatus::OpenFileError;
        }

        std::string mp3_file_path = m_wavFilePath.replace(m_wavFilePath.find_last_of('.') + 1, 3, "mp3");
        FILE* mp3File = fopen(mp3_file_path.c_str(), "wb");
        if(!mp3File)
        {
            return EncoderStatus::OpenFileError;
        }

        fread(&m_wavHeader, sizeof(wav_header_t), 1, wavFile);

        auto bytesRead    = std::size_t{};
        auto bytesWritten = std::size_t{};

        do
        {
            bytesRead = fread(m_wavBuffer.get(), m_wavHeader.numChannels * sizeof(short), CHUNK_SIZE, wavFile);

            if (bytesRead != 0)
            {
                if (m_wavHeader.numChannels == 1)
                {
                    bytesWritten = lame_encode_buffer(m_lameFlags, m_wavBuffer.get(), nullptr, static_cast<int>(bytesRead), m_mp3Buffer.get(), CHUNK_SIZE);
                }
                else
                {
                    bytesWritten = lame_encode_buffer_interleaved(m_lameFlags, m_wavBuffer.get(), static_cast<int>(bytesRead), m_mp3Buffer.get(), CHUNK_SIZE);
                }
            }
            else
            {
                bytesWritten = lame_encode_flush(m_lameFlags, m_mp3Buffer.get(), CHUNK_SIZE);
            }

            if (bytesWritten < 0)
            {
                fclose(wavFile);
                fclose(mp3File);
                return EncoderStatus::EncodeBufferError;
            }

            fwrite(m_mp3Buffer.get(), bytesWritten, 1, mp3File);

        } while (bytesRead != 0);

        fclose(wavFile);
        fclose(mp3File);

        return EncoderStatus::StatusOk;
    }